

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::ProjectionLight::PDF_Le(ProjectionLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  Float FVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float n2;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float z;
  undefined1 auVar16 [16];
  Tuple2<pbrt::Point2,_float> local_18;
  
  *pdfPos = 0.0;
  fVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                   [1])),ZEXT416((uint)fVar6),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar1),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar6 = auVar16._0_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar8,auVar8);
  auVar16 = vfmadd231ss_fma(auVar16,auVar7,auVar7);
  if (auVar16._0_4_ < 0.0) {
    fVar4 = sqrtf(auVar16._0_4_);
    auVar7 = ZEXT416(auVar7._0_4_);
    auVar8 = ZEXT416(auVar8._0_4_);
  }
  else {
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar4 = auVar16._0_4_;
  }
  auVar16._0_4_ = auVar7._0_4_ / fVar4;
  auVar16._4_12_ = auVar7._4_12_;
  if (this->hither <= auVar16._0_4_) {
    fVar6 = fVar6 / fVar4;
    auVar10._0_4_ = auVar8._0_4_ / fVar4;
    auVar10._4_12_ = auVar8._4_12_;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->ScreenFromLight).m.m[3][1])),auVar10,
                             ZEXT416((uint)(this->ScreenFromLight).m.m[3][0]));
    auVar8 = vfmadd231ss_fma(auVar8,auVar16,ZEXT416((uint)(this->ScreenFromLight).m.m[3][2]));
    fVar4 = auVar8._0_4_ + (this->ScreenFromLight).m.m[3][3];
    auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->ScreenFromLight).m.m[0] + 1),
                           ZEXT416((uint)(this->ScreenFromLight).m.m[1][1]),0x10);
    auVar7._0_4_ = fVar6 * auVar8._0_4_;
    auVar7._4_4_ = fVar6 * auVar8._4_4_;
    auVar7._8_4_ = fVar6 * auVar8._8_4_;
    auVar7._12_4_ = fVar6 * auVar8._12_4_;
    auVar8 = vinsertps_avx((undefined1  [16])(this->ScreenFromLight).m.m[0],
                           ZEXT416((uint)(this->ScreenFromLight).m.m[1][0]),0x10);
    auVar11._4_4_ = auVar10._0_4_;
    auVar11._0_4_ = auVar10._0_4_;
    auVar11._8_4_ = auVar10._0_4_;
    auVar11._12_4_ = auVar10._0_4_;
    auVar7 = vfmadd213ps_fma(auVar11,auVar8,auVar7);
    auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->ScreenFromLight).m.m[0] + 2),
                           ZEXT416((uint)(this->ScreenFromLight).m.m[1][2]),0x10);
    auVar15._4_4_ = auVar16._0_4_;
    auVar15._0_4_ = auVar16._0_4_;
    auVar15._8_4_ = auVar16._0_4_;
    auVar15._12_4_ = auVar16._0_4_;
    auVar7 = vfmadd213ps_fma(auVar15,auVar8,auVar7);
    auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->ScreenFromLight).m.m[0] + 3),
                           ZEXT416((uint)(this->ScreenFromLight).m.m[1][3]),0x10);
    auVar12._0_4_ = auVar8._0_4_ + auVar7._0_4_;
    auVar12._4_4_ = auVar8._4_4_ + auVar7._4_4_;
    auVar12._8_4_ = auVar8._8_4_ + auVar7._8_4_;
    auVar12._12_4_ = auVar8._12_4_ + auVar7._12_4_;
    auVar8._4_4_ = fVar4;
    auVar8._0_4_ = fVar4;
    auVar8._8_4_ = fVar4;
    auVar8._12_4_ = fVar4;
    auVar8 = vdivps_avx(auVar12,auVar8);
    if ((fVar4 == 1.0) && (!NAN(fVar4))) {
      auVar8 = auVar12;
    }
    auVar13._8_8_ = auVar8._0_8_;
    auVar13._0_8_ = auVar8._0_8_;
    uVar3 = vcmpps_avx512vl(auVar13,(undefined1  [16])this->screenBounds,2);
    uVar2 = vcmpps_avx512vl((undefined1  [16])this->screenBounds,auVar13,2);
    auVar7 = vpmovm2d_avx512vl(uVar3);
    auVar10 = vpmovm2d_avx512vl(uVar2);
    auVar7 = vpblendd_avx2(auVar10,auVar7,0xc);
    uVar3 = vpmovd2m_avx512vl(auVar7);
    if ((~(ushort)uVar3 & 0xf) == 0) {
      local_18 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8);
      FVar5 = PiecewiseConstant2D::PDF(&this->distrib,(Point2f *)&local_18);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar7 = vsubps_avx(auVar14,auVar9);
      auVar8 = vmovshdup_avx(auVar7);
      *pdfDir = (FVar5 * auVar7._0_4_ * auVar8._0_4_) /
                (auVar16._0_4_ * auVar16._0_4_ * auVar16._0_4_ * this->A);
      return;
    }
  }
  *pdfDir = 0.0;
  return;
}

Assistant:

void ProjectionLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;

    Vector3f w = Normalize(renderFromLight.ApplyInverse(ray.d));
    if (w.z < hither) {
        *pdfDir = 0;
        return;
    }
    Point3f ps = ScreenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds)) {
        *pdfDir = 0;
        return;
    }
    *pdfDir = distrib.PDF(Point2f(ps.x, ps.y)) * screenBounds.Area() / (A * Pow<3>(w.z));
}